

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void conditionalBranchStatement(object *proc,int retSize)

{
  item *x;
  int iVar1;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  if (currentSymbol == 0x12d) {
    getSymbol();
    expression(x);
    cJump(x);
    if (currentSymbol == 0x12e) {
      getSymbol();
      if (currentSymbol == 0x131) {
        getSymbol();
        statementSequence(proc,retSize);
        if (currentSymbol == 0x132) {
          getSymbol();
          iVar1 = 0;
          while (currentSymbol == 0x25c) {
            getSymbol();
            if (currentSymbol == 0x12d) {
              getSymbol();
              put(0x28,0,0,iVar1);
              iVar1 = pc;
              fixLink(x->a);
              expression(x);
              cJump(x);
              if (currentSymbol != 0x12e) goto LAB_001064dd;
              iVar1 = iVar1 + -1;
              getSymbol();
            }
            if (currentSymbol != 0x131) goto LAB_001064cb;
            getSymbol();
            statementSequence(proc,retSize);
            if (currentSymbol != 0x132) {
              msg = "missing right curly bracket in elseif";
              goto LAB_001064e4;
            }
            getSymbol();
          }
          if (currentSymbol != 0x25b) {
            fixLink(x->a);
LAB_001064ba:
            fixLink(iVar1);
            return;
          }
          getSymbol();
          put(0x28,0,0,iVar1);
          iVar1 = pc;
          fixLink(x->a);
          if (currentSymbol != 0x131) {
            msg = "missing left curly bracket in else";
            goto LAB_001064e4;
          }
          getSymbol();
          statementSequence(proc,retSize);
          if (currentSymbol == 0x132) {
            iVar1 = iVar1 + -1;
            getSymbol();
            goto LAB_001064ba;
          }
        }
        msg = "missing right curly bracket";
      }
      else {
LAB_001064cb:
        msg = "missing left curly bracket";
      }
    }
    else {
LAB_001064dd:
      msg = "missing closing right paranetheses of if statement";
    }
  }
  else {
    msg = "missing left paranetheses in if statement";
  }
LAB_001064e4:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void conditionalBranchStatement(struct object *proc, int retSize) {
	variable int L;
	variable struct item *x;
	x=NULL; L=0;
	allocMem(x);
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		expression(x);
		cJump(x);
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} else {
			mark("missing closing right paranetheses of if statement");
			exit(-1);
		}
	} else {
		mark("missing left paranetheses in if statement");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_CLBRAK) {
		getSymbol(); 
		statementSequence(proc, retSize); L = 0;
		if (currentSymbol == SYMBOL_CRBRAK) {
			getSymbol();
		} else {
			mark("missing right curly bracket");
			exit(-1);
		}
	} else {
		mark("missing left curly bracket");
		exit(-1);
	}
	while (currentSymbol == SYMBOL_ELSIF) {
		getSymbol();
		if (currentSymbol == SYMBOL_LPARAN) {
			getSymbol(); L = fJump(L); fixLink(x->a); expression(x); cJump(x);
			if (currentSymbol == SYMBOL_RPARAN) {
				getSymbol();
			} else {
				mark("missing closing right paranetheses of if statement");
				exit(-1);
			}
		}
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket in elseif");
					exit(-1);
			}
		} else {
			mark("missing left curly bracket");
			exit(-1);
		}
	}
    if (currentSymbol == SYMBOL_ELSE) {
		getSymbol(); 
		L = fJump(L); 
		fixLink(x->a);
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket");
				exit(-1);
			}
		} else {
			mark("missing left curly bracket in else");
			exit(-1);
		}
	} else {
		fixLink(x->a);
	}
	fixLink(L);
}